

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O3

pair<spvtools::EnumSet<spvtools::Extension>::Iterator,_bool> * __thiscall
spvtools::EnumSet<spvtools::Extension>::insert
          (pair<spvtools::EnumSet<spvtools::Extension>::Iterator,_bool> *__return_storage_ptr__,
          EnumSet<spvtools::Extension> *this,Extension *value)

{
  Extension value_00;
  pointer pBVar1;
  ulong uVar2;
  bool bVar3;
  size_t index;
  Extension EVar4;
  
  index = FindBucketForValue(this,*value);
  value_00 = *value;
  EVar4 = value_00 & kSPV_INTEL_masked_gather_scatter;
  pBVar1 = (this->buckets_).
           super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((index < (ulong)((long)(this->buckets_).
                             super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 4)) &&
     (pBVar1[index].start == (value_00 & ~kSPV_INTEL_masked_gather_scatter))) {
    uVar2 = pBVar1[index].data;
    if ((uVar2 >> EVar4 & 1) != 0) {
      bVar3 = false;
      goto LAB_001bcdb7;
    }
    this->size_ = this->size_ + 1;
    pBVar1[index].data = uVar2 | 1L << (sbyte)EVar4;
  }
  else {
    this->size_ = this->size_ + 1;
    InsertBucketFor(this,index,value_00);
  }
  bVar3 = true;
LAB_001bcdb7:
  (__return_storage_ptr__->first).set_ = this;
  (__return_storage_ptr__->first).bucketIndex_ = index;
  (__return_storage_ptr__->first).bucketOffset_ = EVar4;
  __return_storage_ptr__->second = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(const T& value) {
    const size_t index = FindBucketForValue(value);
    const ElementType offset = ComputeBucketOffset(value);

    if (index >= buckets_.size() ||
        buckets_[index].start != ComputeBucketStart(value)) {
      size_ += 1;
      InsertBucketFor(index, value);
      return std::make_pair(Iterator(this, index, offset), true);
    }

    auto& bucket = buckets_[index];
    const auto mask = ComputeMaskForValue(value);
    if (bucket.data & mask) {
      return std::make_pair(Iterator(this, index, offset), false);
    }

    size_ += 1;
    bucket.data |= ComputeMaskForValue(value);
    return std::make_pair(Iterator(this, index, offset), true);
  }